

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O3

void __thiscall SDLFB::ResetSDLRenderer(SDLFB *this)

{
  SDL_PixelFormat *pSVar1;
  bool bVar2;
  int iVar3;
  SDL_Surface *pSVar4;
  SDL_Renderer *pSVar5;
  SDL_Texture *pSVar6;
  uint32 redMask;
  undefined8 uVar7;
  Uint32 Rmask;
  Uint32 format;
  int bpp;
  Uint32 Amask;
  Uint32 Bmask;
  Uint32 Gmask;
  uint32 local_40;
  int local_3c;
  uint local_38;
  undefined1 local_34 [4];
  uint32 local_30;
  uint32 local_2c;
  
  pSVar5 = this->Renderer;
  if (pSVar5 != (SDL_Renderer *)0x0) {
    if ((this->field_8).Texture != (SDL_Texture *)0x0) {
      SDL_DestroyTexture((this->field_8).Texture);
      pSVar5 = this->Renderer;
    }
    SDL_DestroyRenderer(pSVar5);
  }
  bVar2 = vid_forcesurface.Value;
  this->UsingRenderer = (bool)(vid_forcesurface.Value ^ 1);
  if (bVar2 == false) {
    pSVar5 = (SDL_Renderer *)
             SDL_CreateRenderer(this->Screen,0xffffffff,(uint)vid_vsync.Value * 4 + 10);
    this->Renderer = pSVar5;
    if (pSVar5 == (SDL_Renderer *)0x0) {
      return;
    }
    SDL_SetRenderDrawColor(pSVar5,0,0,0,0xff);
    uVar7 = 0x16362004;
    if (vid_displaybits.Value < 0x18) {
      if (vid_displaybits.Value == 0xf) {
        uVar7 = 0x15331002;
      }
      else if (vid_displaybits.Value == 0x10) {
        uVar7 = 0x15151002;
      }
    }
    else if (vid_displaybits.Value == 0x18) {
      uVar7 = 0x16161804;
    }
    else if (vid_displaybits.Value == 0x1e) {
      uVar7 = 0x16372004;
    }
    pSVar6 = (SDL_Texture *)
             SDL_CreateTexture(this->Renderer,uVar7,1,
                               (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                               (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height);
    (this->field_8).Texture = pSVar6;
    this->NotPaletted = true;
    SDL_QueryTexture(pSVar6,&local_3c,0,0,0);
    SDL_PixelFormatEnumToMasks(local_3c,&local_38,&local_40,&local_2c,&local_30,local_34);
    redMask = local_40;
  }
  else {
    pSVar4 = (SDL_Surface *)SDL_GetWindowSurface();
    (this->field_8).Surface = pSVar4;
    pSVar1 = pSVar4->format;
    if (pSVar1->palette != (SDL_Palette *)0x0) {
      this->NotPaletted = false;
      goto LAB_002ca635;
    }
    this->NotPaletted = true;
    local_38 = (uint)pSVar1->BitsPerPixel;
    local_2c = pSVar1->Gmask;
    local_30 = pSVar1->Bmask;
    redMask = pSVar1->Rmask;
  }
  PfxState::SetFormat(&GPfx,local_38,redMask,local_2c,local_30);
LAB_002ca635:
  iVar3 = (*(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
            [0x21])(this);
  if ((char)iVar3 != '\0') {
    SDL_GetWindowSize(this->Screen,&local_3c,&local_40);
    ScaleWithAspect(&local_3c,(int *)&local_40,
                    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height);
    SDL_RenderSetLogicalSize(this->Renderer,local_3c,local_40);
  }
  return;
}

Assistant:

void SDLFB::ResetSDLRenderer ()
{
	if (Renderer)
	{
		if (Texture)
			SDL_DestroyTexture (Texture);
		SDL_DestroyRenderer (Renderer);
	}

	UsingRenderer = !vid_forcesurface;
	if (UsingRenderer)
	{
		Renderer = SDL_CreateRenderer (Screen, -1,SDL_RENDERER_ACCELERATED|SDL_RENDERER_TARGETTEXTURE|
										(vid_vsync ? SDL_RENDERER_PRESENTVSYNC : 0));
		if (!Renderer)
			return;

		SDL_SetRenderDrawColor(Renderer, 0, 0, 0, 255);

		Uint32 fmt;
		switch(vid_displaybits)
		{
			default: fmt = SDL_PIXELFORMAT_ARGB8888; break;
			case 30: fmt = SDL_PIXELFORMAT_ARGB2101010; break;
			case 24: fmt = SDL_PIXELFORMAT_RGB888; break;
			case 16: fmt = SDL_PIXELFORMAT_RGB565; break;
			case 15: fmt = SDL_PIXELFORMAT_ARGB1555; break;
		}
		Texture = SDL_CreateTexture (Renderer, fmt, SDL_TEXTUREACCESS_STREAMING, Width, Height);

		{
			NotPaletted = true;

			Uint32 format;
			SDL_QueryTexture(Texture, &format, NULL, NULL, NULL);

			Uint32 Rmask, Gmask, Bmask, Amask;
			int bpp;
			SDL_PixelFormatEnumToMasks(format, &bpp, &Rmask, &Gmask, &Bmask, &Amask);
			GPfx.SetFormat (bpp, Rmask, Gmask, Bmask);
		}
	}
	else
	{
		Surface = SDL_GetWindowSurface (Screen);

		if (Surface->format->palette == NULL)
		{
			NotPaletted = true;
			GPfx.SetFormat (Surface->format->BitsPerPixel, Surface->format->Rmask, Surface->format->Gmask, Surface->format->Bmask);
		}
		else
			NotPaletted = false;
	}

	// In fullscreen, set logical size according to animorphic ratio.
	// Windowed modes are rendered to fill the window (usually 1:1)
	if (IsFullscreen ())
	{
		int w, h;
		SDL_GetWindowSize (Screen, &w, &h);
		ScaleWithAspect (w, h, Width, Height);
		SDL_RenderSetLogicalSize (Renderer, w, h);
	}
}